

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Attribute.cpp
# Opt level: O2

cali_attr_type __thiscall cali::Attribute::type(Attribute *this)

{
  Node *pNVar1;
  cali_attr_type cVar2;
  Variant local_18;
  
  while( true ) {
    pNVar1 = this->m_node;
    if (pNVar1 == (Node *)0x0) {
      return CALI_TYPE_INV;
    }
    if (pNVar1->m_attribute == 9) break;
    this = (Attribute *)
           ((long)&(((pNVar1->super_LockfreeIntrusiveTree<cali::Node>).m_me)->
                   super_LockfreeIntrusiveTree<cali::Node>).m_me +
           (pNVar1->super_LockfreeIntrusiveTree<cali::Node>).m_node);
  }
  local_18.m_v.type_and_size = (pNVar1->m_data).m_v.type_and_size;
  local_18.m_v.value = (pNVar1->m_data).m_v.value;
  cVar2 = Variant::to_attr_type(&local_18,(bool *)0x0);
  return cVar2;
}

Assistant:

cali_attr_type Attribute::type() const
{
    for (const Node* node = m_node; node; node = node->parent())
        if (node->attribute() == TYPE_ATTR_ID)
            return node->data().to_attr_type();

    return CALI_TYPE_INV;
}